

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

void sq_setnativedebughook(HSQUIRRELVM v,SQDEBUGHOOK hook)

{
  v->_debughook_native = hook;
  SQObjectPtr::Null(&v->_debughook_closure);
  v->_debughook = hook != (SQDEBUGHOOK)0x0;
  return;
}

Assistant:

void sq_setnativedebughook(HSQUIRRELVM v,SQDEBUGHOOK hook)
{
    v->_debughook_native = hook;
    v->_debughook_closure.Null();
    v->_debughook = hook?true:false;
}